

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb::
     HistogramUpdateFunction<duckdb::HistogramFunctor,short,duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  bool bVar1;
  HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  **ppHVar2;
  map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *this;
  idx_t iVar3;
  idx_t in_R8;
  short *input_value;
  HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  *state;
  idx_t idx;
  idx_t i;
  short *input_values;
  HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat input_data;
  bool extra_state;
  UnifiedVectorFormat sdata;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffec8;
  ArenaAllocator *in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  Vector *in_stack_fffffffffffffee0;
  HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  **ppHVar4;
  HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
  *__k;
  ulong local_e8;
  UnifiedVectorFormat local_d0;
  undefined1 local_85;
  SelectionVector *local_78;
  UnifiedVectorFormat *in_stack_ffffffffffffff90;
  unsigned_long *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffee0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffa0,(idx_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_85 = HistogramFunctor::CreateExtraState(in_R8);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffee0);
  HistogramFunctor::PrepareData
            (in_stack_fffffffffffffee0,(idx_t)in_stack_fffffffffffffed8,
             (bool *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ppHVar2 = UnifiedVectorFormat::
            GetData<duckdb::HistogramAggState<short,std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>*>
                      ((UnifiedVectorFormat *)&local_78);
  UnifiedVectorFormat::GetData<short>(&local_d0);
  for (local_e8 = 0; local_e8 < in_R8; local_e8 = local_e8 + 1) {
    this = (map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
            *)SelectionVector::get_index(local_d0.sel,local_e8);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0);
    if (bVar1) {
      ppHVar4 = ppHVar2;
      iVar3 = SelectionVector::get_index(local_78,local_e8);
      __k = ppHVar4[iVar3];
      if (__k->hist ==
          (map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
           *)0x0) {
        in_stack_fffffffffffffed8 =
             (TemplatedValidityMask<unsigned_long> *)
             DefaultMapType<std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
             ::CreateEmpty(in_stack_fffffffffffffed0);
        __k->hist = (map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffed8;
      }
      in_stack_fffffffffffffed0 =
           (ArenaAllocator *)
           ::std::
           map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
           ::operator[](this,(key_type_conflict6 *)__k);
      in_stack_fffffffffffffed0->allocator =
           (Allocator *)((long)&in_stack_fffffffffffffed0->allocator->allocate_function + 1);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffed0);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffed0);
  return;
}

Assistant:

static void HistogramUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                    Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);

	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, typename MAP_TYPE::MAP_TYPE> *>(sdata);
	auto input_values = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			state.hist = MAP_TYPE::CreateEmpty(aggr_input.allocator);
		}
		auto &input_value = input_values[idx];
		++(*state.hist)[input_value];
	}
}